

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int resolve_descendant_schema_nodeid
              (char *nodeid,lys_node *start,int ret_nodetype,int check_shorthand,int no_innerlist,
              lys_node **ret)

{
  lys_module *module;
  char *pcVar1;
  uint uVar2;
  int iVar3;
  lys_node *plVar4;
  size_t __n;
  int iVar5;
  char *local_78;
  char *name;
  char *mod_name;
  LYS_NODE local_60;
  int local_5c;
  lys_node *local_58;
  char *local_50;
  lys_node **local_48;
  int local_40;
  int local_3c;
  int nam_len;
  int mod_name_len;
  int is_relative;
  int8_t shorthand;
  
  nam_len = -1;
  mod_name_len._3_1_ = -(check_shorthand == 0);
  if ((nodeid == (char *)0x0) || (ret == (lys_node **)0x0)) {
    __assert_fail("nodeid && ret",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x6f3,
                  "int resolve_descendant_schema_nodeid(const char *, const struct lys_node *, int, int, int, const struct lys_node **)"
                 );
  }
  if ((ret_nodetype & 0x3800U) != 0) {
    __assert_fail("!(ret_nodetype & (LYS_USES | LYS_AUGMENT | LYS_GROUPING))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x6f4,
                  "int resolve_descendant_schema_nodeid(const char *, const struct lys_node *, int, int, int, const struct lys_node **)"
                 );
  }
  if (start == (lys_node *)0x0) {
LAB_001149a9:
    iVar5 = 0;
  }
  else {
    module = start->module;
    local_60 = ret_nodetype;
    local_5c = no_innerlist;
    uVar2 = parse_schema_nodeid(nodeid,&name,&local_3c,&local_78,&local_40,&nam_len,(int *)0x0);
    if ((int)uVar2 < 1) {
      iVar5 = 1 - uVar2;
    }
    else {
      iVar5 = -1;
      mod_name = nodeid;
      local_48 = ret;
      if (nam_len != 0) {
        do {
          start = lys_parent(start);
          if (start->nodetype != LYS_USES) break;
          plVar4 = lys_parent(start);
        } while (plVar4 != (lys_node *)0x0);
        iVar5 = 0;
        local_58 = start;
        plVar4 = lys_getnext((lys_node *)0x0,start,module,0x83);
        if (plVar4 != (lys_node *)0x0) {
          local_50 = mod_name + uVar2;
          do {
            pcVar1 = plVar4->name;
            if (pcVar1 != (char *)0x0) {
              __n = (size_t)local_40;
              iVar3 = strncmp(local_78,pcVar1,__n);
              if ((iVar3 == 0) && (pcVar1[__n] == '\0')) {
                iVar3 = schema_nodeid_siblingcheck
                                  (plVar4,(int8_t *)((long)&mod_name_len + 3),local_50,module,name,
                                   local_3c,0,&local_58);
                pcVar1 = local_50;
                if (iVar3 == 0) {
                  if ((plVar4->nodetype & local_60) != LYS_UNKNOWN) {
                    *local_48 = plVar4;
                    goto LAB_001149a9;
                  }
                }
                else if (iVar3 != 1) {
                  if (iVar3 != 2) {
                    return -1;
                  }
                  if ((local_5c != 0) && (plVar4->nodetype == LYS_LIST)) {
                    *local_48 = (lys_node *)0x0;
                    return -2;
                  }
                  uVar2 = parse_schema_nodeid(local_50,&name,&local_3c,&local_78,&local_40,&nam_len,
                                              (int *)0x0);
                  if ((int)uVar2 < 1) {
                    return ((int)pcVar1 - ((int)mod_name + uVar2)) + 1;
                  }
                  local_50 = pcVar1 + uVar2;
                  plVar4 = (lys_node *)0x0;
                }
              }
            }
            plVar4 = lys_getnext(plVar4,local_58,module,0x83);
          } while (plVar4 != (lys_node *)0x0);
        }
        *local_48 = (lys_node *)0x0;
      }
    }
  }
  return iVar5;
}

Assistant:

int
resolve_descendant_schema_nodeid(const char *nodeid, const struct lys_node *start, int ret_nodetype,
                                 int check_shorthand, int no_innerlist, const struct lys_node **ret)
{
    const char *name, *mod_name, *id;
    const struct lys_node *sibling, *start_parent;
    int r, nam_len, mod_name_len, is_relative = -1;
    int8_t shorthand = check_shorthand ? 0 : -1;
    /* resolved import module from the start module, it must match the next node-name-match sibling */
    const struct lys_module *module;

    assert(nodeid && ret);
    assert(!(ret_nodetype & (LYS_USES | LYS_AUGMENT | LYS_GROUPING)));

    if (!start) {
        /* leaf not found */
        return 0;
    }

    id = nodeid;
    module = start->module;

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL)) < 1) {
        return ((id - nodeid) - r) + 1;
    }
    id += r;

    if (!is_relative) {
        return -1;
    }

    start_parent = lys_parent(start);
    while ((start_parent->nodetype == LYS_USES) && lys_parent(start_parent)) {
        start_parent = lys_parent(start_parent);
    }

    while (1) {
        sibling = NULL;
        while ((sibling = lys_getnext(sibling, start_parent, module,
                                      LYS_GETNEXT_WITHCHOICE | LYS_GETNEXT_WITHCASE | LYS_GETNEXT_PARENTUSES))) {
            /* name match */
            if (sibling->name && !strncmp(name, sibling->name, nam_len) && !sibling->name[nam_len]) {
                r = schema_nodeid_siblingcheck(sibling, &shorthand, id, module, mod_name, mod_name_len, 0, &start_parent);
                if (r == 0) {
                    if (!(sibling->nodetype & ret_nodetype)) {
                        /* wrong node type, too bad */
                        continue;
                    }
                    *ret = sibling;
                    return EXIT_SUCCESS;
                } else if (r == 1) {
                    continue;
                } else if (r == 2) {
                    break;
                } else {
                    return -1;
                }
            }
        }

        /* no match */
        if (!sibling) {
            *ret = NULL;
            return EXIT_SUCCESS;
        } else if (no_innerlist && sibling->nodetype == LYS_LIST) {
            *ret = NULL;
            return -2;
        }

        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL)) < 1) {
            return ((id - nodeid) - r) + 1;
        }
        id += r;
    }

    /* cannot get here */
    LOGINT;
    return -1;
}